

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O0

void __thiscall
dg::vr::VectorSet<llvm::Value_const*>::emplace<llvm::Value_const*&>
          (VectorSet<const_llvm::Value_*> *this,Value **vals)

{
  bool bVar1;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *in_RSI;
  Value *val;
  Value **val_00;
  
  val_00 = (((_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
            &(in_RSI->super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)
             ._M_impl)->_M_impl).super__Vector_impl_data._M_start;
  bVar1 = contains<llvm::Value_const*>((VectorSet<const_llvm::Value_*> *)in_RSI,val_00);
  if (!bVar1) {
    std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
    emplace_back<llvm::Value_const*>(in_RSI,val_00);
  }
  return;
}

Assistant:

void emplace(S &&...vals) {
        T val(std::forward<S>(vals)...);
        if (!contains(val))
            vec.emplace_back(std::move(val));
    }